

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::do_resume(torrent *this)

{
  int *piVar1;
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  *plVar2;
  ulong uVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  time_point32 tVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _List_node_base *p_Var8;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_28;
  
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) != 0) {
    bVar4 = want_tick(this);
    update_list(this,(torrent_list_index_t)0x1,bVar4);
    return;
  }
  plVar2 = &this->m_extensions;
  p_Var8 = (_List_node_base *)plVar2;
  do {
    p_Var8 = (((_List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
                *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var8 == (_List_node_base *)plVar2) goto LAB_00333a7e;
    cVar5 = (**(code **)(*(long *)p_Var8[1]._M_next + 0x38))();
  } while (cVar5 == '\0');
  if (p_Var8 == (_List_node_base *)plVar2) {
LAB_00333a7e:
    iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    if ((*(uint *)(CONCAT44(extraout_var,iVar6) + 0x68) & 0x40) != 0) {
      iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)&stack0xffffffffffffffd0);
      alert_manager::emplace_alert<libtorrent::torrent_resumed_alert,libtorrent::torrent_handle>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar6),
                 (torrent_handle *)&stack0xffffffffffffffd0);
      if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           )local_28._M_head_impl !=
          (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           )0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)((long)local_28._M_head_impl + 0xc);
          iVar6 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar6 = *(int *)((long)local_28._M_head_impl + 0xc);
          *(int *)((long)local_28._M_head_impl + 0xc) = iVar6 + -1;
        }
        if (iVar6 == 1) {
          (**(code **)(*(long *)local_28._M_head_impl + 0x18))();
        }
      }
    }
    this->field_0x5e0 = this->field_0x5e0 | 1;
    this->field_0x5c0 = this->field_0x5c0 | 3;
    tVar7 = time_now32();
    (this->m_started).__d.__r = (rep_conflict)tVar7.__d.__r;
    bVar4 = is_seed(this);
    if (bVar4) {
      (this->m_became_seed).__d.__r = (rep_conflict)tVar7.__d.__r;
    }
    bVar4 = is_finished(this);
    if (bVar4) {
      (this->m_became_finished).__d.__r = (rep_conflict)tVar7.__d.__r;
    }
    clear_error(this);
    if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xe00000000000000) ==
         0x200000000000000) && ((this->field_0x600 & 1) != 0)) {
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c]
      )();
    }
    uVar3 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    if ((((uVar3 & 0xe00000008000000) == 0x200000000000000) && ((uVar3 & 0x14000000) == 0)) &&
       ((this->m_error).failed_ == false)) {
      start_checking(this);
    }
    state_updated(this);
    update_want_peers(this);
    bVar4 = want_tick(this);
    update_list(this,(torrent_list_index_t)0x1,bVar4);
    update_want_scrape(this);
    update_gauge(this);
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xe00000000000000) !=
        0x200000000000000) {
      start_announcing(this);
      do_connect_boost(this);
    }
  }
  return;
}

Assistant:

void torrent::do_resume()
	{
		TORRENT_ASSERT(is_single_thread());
		if (is_paused())
		{
			update_want_tick();
			return;
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			if (ext->on_resume()) return;
		}
#endif

		if (alerts().should_post<torrent_resumed_alert>())
			alerts().emplace_alert<torrent_resumed_alert>(get_handle());

		m_announce_to_dht = true;
		m_announce_to_trackers = true;
		m_announce_to_lsd = true;

		m_started = aux::time_now32();
		if (is_seed()) m_became_seed = m_started;
		if (is_finished()) m_became_finished = m_started;

		clear_error();

		if (m_state == torrent_status::checking_files
			&& m_auto_managed)
		{
			m_ses.trigger_auto_manage();
		}

		if (should_check_files()) start_checking();

		state_updated();
		update_want_peers();
		update_want_tick();
		update_want_scrape();
		update_gauge();

		if (m_state == torrent_status::checking_files) return;

		start_announcing();

		do_connect_boost();
	}